

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void GrcManager::DebugHex(ostream *strmOut,gid16 wGlyphID)

{
  _Setfill<char> _Var1;
  fmtflags __fmtfl;
  _Setw _Var2;
  void *this;
  ostream *poVar3;
  ushort in_SI;
  long *in_RDI;
  char_type fill;
  fmtflags flags;
  
  __fmtfl = std::ios_base::flags((ios_base *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),_S_hex);
  std::ios::fill();
  this = (void *)std::ostream::operator<<(in_RDI,std::hex);
  poVar3 = (ostream *)std::ostream::operator<<(this,std::noshowbase);
  poVar3 = std::operator<<(poVar3,"0x");
  _Var1 = std::setfill<char>('0');
  poVar3 = std::operator<<(poVar3,_Var1._M_c);
  _Var2 = std::setw(4);
  poVar3 = std::operator<<(poVar3,_Var2);
  std::ostream::operator<<(poVar3,in_SI);
  std::ios_base::flags((ios_base *)((long)in_RDI + *(long *)(*in_RDI + -0x18)),__fmtfl);
  std::ios::fill((char)in_RDI + (char)*(undefined8 *)(*in_RDI + -0x18));
  return;
}

Assistant:

void GrcManager::DebugHex(std::ostream & strmOut, gid16 wGlyphID)
{
	auto const flags = strmOut.flags(std::ios::hex); auto const fill = strmOut.fill();
	strmOut << std::hex << std::noshowbase
			<< "0x"  << std::setfill('0') << std::setw(4) << wGlyphID;
	strmOut.flags(flags); strmOut.fill(fill);
}